

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfilesystemmodel.cpp
# Opt level: O1

void QFileSystemModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  QFlagsStorageHelper<QFileSystemModel::Option,_4> *pQVar2;
  undefined1 uVar3;
  QFlagsStorageHelper<QFileSystemModel::Option,_4> QVar4;
  int iVar5;
  long in_FS_OFFSET;
  void *local_58;
  void *pvStack_50;
  void *local_48;
  void *pvStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  switch(_c) {
  case InvokeMetaMethod:
    if (_id == 2) {
      pvStack_50 = _a[1];
      iVar5 = 2;
LAB_0062559e:
      local_58 = (void *)0x0;
      QMetaObject::activate(_o,&staticMetaObject,iVar5,&local_58);
    }
    else {
      if (_id == 1) {
        pvStack_40 = _a[3];
        pvStack_50 = _a[1];
        local_48 = _a[2];
        iVar5 = 1;
        goto LAB_0062559e;
      }
      if (_id == 0) {
        pvStack_50 = _a[1];
        iVar5 = 0;
        goto LAB_0062559e;
      }
    }
    if (_c == ReadProperty) goto switchD_006254fa_caseD_1;
    if (_c != WriteProperty) {
      if (_c != IndexOfMethod) goto switchD_006254fa_caseD_3;
      goto switchD_006254fa_caseD_5;
    }
    break;
  case ReadProperty:
switchD_006254fa_caseD_1:
    if ((uint)_id < 4) {
      pQVar2 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
      switch(_id) {
      case 0:
        uVar3 = QFileInfoGatherer::resolveSymlinks
                          (*(QFileInfoGatherer **)(*(long *)(_o + 8) + 0xe0));
        break;
      case 1:
        uVar3 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b1);
        break;
      case 2:
        uVar3 = *(undefined1 *)(*(long *)(_o + 8) + 0x1b3);
        break;
      case 3:
        QVar4.super_QFlagsStorage<QFileSystemModel::Option>.i =
             (QFlagsStorage<QFileSystemModel::Option>)options((QFileSystemModel *)_o);
        pQVar2->super_QFlagsStorage<QFileSystemModel::Option> =
             QVar4.super_QFlagsStorage<QFileSystemModel::Option>.i;
        goto LAB_0062568d;
      }
      *(undefined1 *)&pQVar2->super_QFlagsStorage<QFileSystemModel::Option> = uVar3;
    }
LAB_0062568d:
    if (_c != WriteProperty) goto switchD_006254fa_caseD_3;
    break;
  case WriteProperty:
    break;
  default:
    goto switchD_006254fa_caseD_3;
  case IndexOfMethod:
switchD_006254fa_caseD_5:
    plVar1 = (long *)_a[1];
    if (((code *)*plVar1 == rootPathChanged) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 0;
      goto switchD_006254fa_caseD_3;
    }
    if (((code *)*plVar1 == fileRenamed) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 1;
      goto switchD_006254fa_caseD_3;
    }
    if (((code *)*plVar1 == directoryLoaded) && (plVar1[1] == 0)) {
      *(undefined4 *)*_a = 2;
      goto switchD_006254fa_caseD_3;
    }
    if (_c != WriteProperty) {
      if (_c != ReadProperty) goto switchD_006254fa_caseD_3;
      goto switchD_006254fa_caseD_1;
    }
  }
  if ((uint)_id < 4) {
    pQVar2 = (QFlagsStorageHelper<QFileSystemModel::Option,_4> *)*_a;
    switch(_id) {
    case 0:
      QFileInfoGatherer::setResolveSymlinks
                (*(QFileInfoGatherer **)(*(long *)(_o + 8) + 0xe0),
                 *(bool *)&pQVar2->super_QFlagsStorage<QFileSystemModel::Option>);
      break;
    case 1:
      *(undefined1 *)(*(long *)(_o + 8) + 0x1b1) =
           *(undefined1 *)&pQVar2->super_QFlagsStorage<QFileSystemModel::Option>;
      break;
    case 2:
      setNameFilterDisables
                ((QFileSystemModel *)_o,
                 *(bool *)&pQVar2->super_QFlagsStorage<QFileSystemModel::Option>);
      break;
    case 3:
      setOptions((QFileSystemModel *)_o,
                 (QFlagsStorageHelper<QFileSystemModel::Option,_4>)
                 pQVar2->super_QFlagsStorage<QFileSystemModel::Option>);
    }
  }
switchD_006254fa_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileSystemModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFileSystemModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rootPathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->fileRenamed((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3]))); break;
        case 2: _t->directoryLoaded((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::rootPathChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & , const QString & , const QString & )>(_a, &QFileSystemModel::fileRenamed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFileSystemModel::*)(const QString & )>(_a, &QFileSystemModel::directoryLoaded, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<bool*>(_v) = _t->resolveSymlinks(); break;
        case 1: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->nameFilterDisables(); break;
        case 3: *reinterpret_cast<Options*>(_v) = _t->options(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setResolveSymlinks(*reinterpret_cast<bool*>(_v)); break;
        case 1: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 2: _t->setNameFilterDisables(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setOptions(*reinterpret_cast<Options*>(_v)); break;
        default: break;
        }
    }
}